

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerHLSL::type_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *type,uint32_t id)

{
  uint32_t *ts;
  BaseType BVar1;
  size_type sVar2;
  CompilerError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  uint32_t *ts_00;
  char *pcVar3;
  uint uVar4;
  spirv_cross local_38 [36];
  uint32_t id_local;
  uint *ts_3;
  
  BVar1 = type->basetype;
  id_local = id;
  if (BVar1 - Image < 2) {
    image_type_hlsl_abi_cxx11_(__return_storage_ptr__,this,type,id);
    return __return_storage_ptr__;
  }
  if (BVar1 == Void) {
    pcVar3 = "void";
    goto LAB_001ac8e8;
  }
  if (BVar1 == Sampler) {
    sVar2 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.comparison_ids._M_h,&id_local);
    pcVar3 = "SamplerComparisonState";
    if (sVar2 == 0) {
      pcVar3 = "SamplerState";
    }
    goto LAB_001ac8e8;
  }
  if (BVar1 == Struct) {
    if ((this->super_CompilerGLSL).backend.explicit_struct_type == true) {
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (local_38,this,(ulong)(type->super_IVariant).self.id);
      join<char_const(&)[8],std::__cxx11::string>
                (__return_storage_ptr__,(spirv_cross *)0x3042b2,(char (*) [8])local_38,ts_1);
      ::std::__cxx11::string::~string((string *)local_38);
      return __return_storage_ptr__;
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (__return_storage_ptr__,this,(ulong)(type->super_IVariant).self.id,1);
    return __return_storage_ptr__;
  }
  uVar4 = type->columns ^ 1 | type->vecsize ^ 1;
  ts_3 = (uint *)(ulong)uVar4;
  if (uVar4 == 0) {
    switch(BVar1) {
    case Boolean:
      pcVar3 = "bool";
      break;
    default:
      goto switchD_001ac931_caseD_3;
    case Short:
      if ((this->hlsl_options).enable_16bit_types == true) {
        pcVar3 = "int16_t";
      }
      else {
        pcVar3 = "min16int";
      }
      break;
    case UShort:
      if ((this->hlsl_options).enable_16bit_types == true) {
        pcVar3 = "uint16_t";
      }
      else {
        pcVar3 = "min16uint";
      }
      break;
    case Int:
      pcVar3 = (this->super_CompilerGLSL).backend.basic_int_type;
      break;
    case UInt:
      pcVar3 = (this->super_CompilerGLSL).backend.basic_uint_type;
      break;
    case Int64:
      if ((this->hlsl_options).shader_model < 0x3c) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"64-bit integers only supported in SM 6.0.");
LAB_001acc62:
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      pcVar3 = "int64_t";
      break;
    case UInt64:
      if ((this->hlsl_options).shader_model < 0x3c) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"64-bit integers only supported in SM 6.0.");
        goto LAB_001acc62;
      }
      pcVar3 = "uint64_t";
      break;
    case AtomicCounter:
      pcVar3 = "atomic_uint";
      break;
    case Half:
      if ((this->hlsl_options).enable_16bit_types == true) {
        pcVar3 = "half";
      }
      else {
        pcVar3 = "min16float";
      }
      break;
    case Float:
      pcVar3 = "float";
      break;
    case Double:
      pcVar3 = "double";
      break;
    case AccelerationStructure:
      pcVar3 = "RaytracingAccelerationStructure";
      break;
    case RayQuery:
      pcVar3 = "RayQuery<RAY_FLAG_NONE>";
    }
    goto LAB_001ac8e8;
  }
  ts = &type->vecsize;
  uVar4 = BVar1 - Boolean;
  if (type->vecsize < 2 || type->columns != 1) {
    if (0xc < uVar4) {
switchD_001ac931_caseD_3:
      pcVar3 = "???";
LAB_001ac8e8:
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)local_38);
      return __return_storage_ptr__;
    }
    ts_00 = &type->columns;
    switch(uVar4) {
    case 0:
      pcVar3 = "bool";
      goto LAB_001acb37;
    default:
      goto switchD_001ac931_caseD_3;
    case 3:
      pcVar3 = "int16_t";
      local_38._0_8_ = "min16int";
      break;
    case 4:
      pcVar3 = "uint16_t";
      local_38._0_8_ = "min16uint";
      break;
    case 5:
      join<char_const(&)[4],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)0x317564,(char (*) [4])ts_00,(uint *)0x344fd9
                 ,(char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    case 6:
      pcVar3 = "uint";
LAB_001acb37:
      join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)pcVar3,(char (*) [5])ts_00,(uint *)0x344fd9,
                 (char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    case 10:
      pcVar3 = "half";
      local_38._0_8_ = "min16float";
      break;
    case 0xb:
      join<char_const(&)[6],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)0x3321aa,(char (*) [6])ts_00,(uint *)0x344fd9
                 ,(char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    case 0xc:
      join<char_const(&)[7],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)0x330d2b,(char (*) [7])ts_00,(uint *)0x344fd9
                 ,(char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    }
    if ((this->hlsl_options).enable_16bit_types != false) {
      local_38._0_8_ = pcVar3;
    }
    join<char_const*,unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
              (__return_storage_ptr__,local_38,(char **)ts_00,(uint *)0x344fd9,(char (*) [2])ts,ts_3
              );
    return __return_storage_ptr__;
  }
  switch(uVar4) {
  case 0:
    pcVar3 = "bool";
    goto LAB_001acbca;
  default:
    goto switchD_001ac931_caseD_3;
  case 3:
    pcVar3 = "int16_t";
    local_38._0_8_ = "min16int";
    break;
  case 4:
    pcVar3 = "uint16_t";
    local_38._0_8_ = "min16uint";
    break;
  case 5:
    join<char_const(&)[4],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)0x317564,(char (*) [4])ts,
               &switchD_001ac97c::switchdataD_0032d2e0);
    return __return_storage_ptr__;
  case 6:
    pcVar3 = "uint";
LAB_001acbca:
    join<char_const(&)[5],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)pcVar3,(char (*) [5])ts,
               &switchD_001ac97c::switchdataD_0032d2e0);
    return __return_storage_ptr__;
  case 7:
    pcVar3 = "i64vec";
    goto LAB_001acbe1;
  case 8:
    pcVar3 = "u64vec";
    goto LAB_001acbe1;
  case 10:
    pcVar3 = "half";
    local_38._0_8_ = "min16float";
    break;
  case 0xb:
    join<char_const(&)[6],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)0x3321aa,(char (*) [6])ts,
               &switchD_001ac97c::switchdataD_0032d2e0);
    return __return_storage_ptr__;
  case 0xc:
    pcVar3 = "double";
LAB_001acbe1:
    join<char_const(&)[7],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)pcVar3,(char (*) [7])ts,
               &switchD_001ac97c::switchdataD_0032d2e0);
    return __return_storage_ptr__;
  }
  if ((this->hlsl_options).enable_16bit_types != false) {
    local_38._0_8_ = pcVar3;
  }
  join<char_const*,unsigned_int_const&>
            (__return_storage_ptr__,local_38,(char **)ts,(uint *)local_38._0_8_);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::type_to_glsl(const SPIRType &type, uint32_t id)
{
	// Ignore the pointer type since GLSL doesn't have pointers.

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		if (backend.explicit_struct_type)
			return join("struct ", to_name(type.self));
		else
			return to_name(type.self);

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_hlsl(type, id);

	case SPIRType::Sampler:
		return comparison_ids.count(id) ? "SamplerComparisonState" : "SamplerState";

	case SPIRType::Void:
		return "void";

	default:
		break;
	}

	if (type.vecsize == 1 && type.columns == 1) // Scalar builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return "bool";
		case SPIRType::Int:
			return backend.basic_int_type;
		case SPIRType::UInt:
			return backend.basic_uint_type;
		case SPIRType::AtomicCounter:
			return "atomic_uint";
		case SPIRType::Half:
			if (hlsl_options.enable_16bit_types)
				return "half";
			else
				return "min16float";
		case SPIRType::Short:
			if (hlsl_options.enable_16bit_types)
				return "int16_t";
			else
				return "min16int";
		case SPIRType::UShort:
			if (hlsl_options.enable_16bit_types)
				return "uint16_t";
			else
				return "min16uint";
		case SPIRType::Float:
			return "float";
		case SPIRType::Double:
			return "double";
		case SPIRType::Int64:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("64-bit integers only supported in SM 6.0.");
			return "int64_t";
		case SPIRType::UInt64:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("64-bit integers only supported in SM 6.0.");
			return "uint64_t";
		case SPIRType::AccelerationStructure:
			return "RaytracingAccelerationStructure";
		case SPIRType::RayQuery:
			return "RayQuery<RAY_FLAG_NONE>";
		default:
			return "???";
		}
	}
	else if (type.vecsize > 1 && type.columns == 1) // Vector builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bool", type.vecsize);
		case SPIRType::Int:
			return join("int", type.vecsize);
		case SPIRType::UInt:
			return join("uint", type.vecsize);
		case SPIRType::Half:
			return join(hlsl_options.enable_16bit_types ? "half" : "min16float", type.vecsize);
		case SPIRType::Short:
			return join(hlsl_options.enable_16bit_types ? "int16_t" : "min16int", type.vecsize);
		case SPIRType::UShort:
			return join(hlsl_options.enable_16bit_types ? "uint16_t" : "min16uint", type.vecsize);
		case SPIRType::Float:
			return join("float", type.vecsize);
		case SPIRType::Double:
			return join("double", type.vecsize);
		case SPIRType::Int64:
			return join("i64vec", type.vecsize);
		case SPIRType::UInt64:
			return join("u64vec", type.vecsize);
		default:
			return "???";
		}
	}
	else
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bool", type.columns, "x", type.vecsize);
		case SPIRType::Int:
			return join("int", type.columns, "x", type.vecsize);
		case SPIRType::UInt:
			return join("uint", type.columns, "x", type.vecsize);
		case SPIRType::Half:
			return join(hlsl_options.enable_16bit_types ? "half" : "min16float", type.columns, "x", type.vecsize);
		case SPIRType::Short:
			return join(hlsl_options.enable_16bit_types ? "int16_t" : "min16int", type.columns, "x", type.vecsize);
		case SPIRType::UShort:
			return join(hlsl_options.enable_16bit_types ? "uint16_t" : "min16uint", type.columns, "x", type.vecsize);
		case SPIRType::Float:
			return join("float", type.columns, "x", type.vecsize);
		case SPIRType::Double:
			return join("double", type.columns, "x", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
}